

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void convertARGBToRGBA64PM_sse4<false>(QRgba64 *buffer,uint *src,int count)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 (*pauVar10) [16];
  undefined8 *puVar11;
  QRgba64 QVar12;
  int in_EDX;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  long in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint s;
  int _i;
  __m128i dst2;
  __m128i dst1;
  __m128i alpha2;
  __m128i alpha1;
  __m128i src2;
  __m128i src1;
  bool cf;
  __m128i srcVector;
  __m128i zero;
  __m128i shuffleMask;
  __m128i rgbaMask;
  __m128i alphaMask;
  int i;
  uint rgb;
  int local_42c;
  undefined1 local_428 [16];
  undefined8 local_418;
  QRgba64 *this;
  int local_368;
  undefined1 local_2b8;
  undefined1 uStack_2b7;
  undefined1 uStack_2b6;
  undefined1 uStack_2b5;
  undefined1 uStack_2b4;
  undefined1 uStack_2b3;
  undefined1 uStack_2b2;
  undefined1 uStack_2b1;
  undefined1 uStack_290;
  undefined1 uStack_28f;
  undefined1 uStack_28e;
  undefined1 uStack_28d;
  undefined1 uStack_28c;
  undefined1 uStack_28b;
  undefined1 uStack_28a;
  undefined1 uStack_289;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rgb = 0x60f020f;
  for (local_368 = 0; local_368 < in_EDX + -3; local_368 = local_368 + 4) {
    pauVar10 = (undefined1 (*) [16])(CONCAT71(in_register_00000031,in_SIL) + (long)local_368 * 4);
    auVar13._8_8_ = 0xff000000ff000000;
    auVar13._0_8_ = 0xff000000ff000000;
    if ((auVar13 & *pauVar10) == (undefined1  [16])0x0) {
      puVar11 = (undefined8 *)(in_RDI + (long)local_368 * 8);
      *puVar11 = 0;
      puVar11[1] = 0;
      puVar11 = (undefined8 *)(in_RDI + (long)(local_368 + 2) * 8);
      *puVar11 = 0;
      puVar11[1] = 0;
    }
    else {
      auVar14._8_8_ = 0xff000000ff000000;
      auVar14._0_8_ = 0xff000000ff000000;
      auVar15._8_8_ = 0xf0c0d0e0b08090a;
      auVar15._0_8_ = 0x704050603000102;
      auVar13 = pshufb(*pauVar10,auVar15);
      local_2b8 = auVar13[0];
      uStack_2b7 = auVar13[1];
      uStack_2b6 = auVar13[2];
      uStack_2b5 = auVar13[3];
      uStack_2b4 = auVar13[4];
      uStack_2b3 = auVar13[5];
      uStack_2b2 = auVar13[6];
      uStack_2b1 = auVar13[7];
      uStack_290 = auVar13[8];
      uStack_28f = auVar13[9];
      uStack_28e = auVar13[10];
      uStack_28d = auVar13[0xb];
      uStack_28c = auVar13[0xc];
      uStack_28b = auVar13[0xd];
      uStack_28a = auVar13[0xe];
      uStack_289 = auVar13[0xf];
      if ((auVar14 & ~*pauVar10) == (undefined1  [16])0x0) {
        puVar11 = (undefined8 *)(in_RDI + (long)local_368 * 8);
        *puVar11 = CONCAT17(uStack_2b5,
                            CONCAT16(uStack_2b5,
                                     CONCAT15(uStack_2b6,
                                              CONCAT14(uStack_2b6,
                                                       CONCAT13(uStack_2b7,
                                                                CONCAT12(uStack_2b7,
                                                                         CONCAT11(local_2b8,
                                                                                  local_2b8)))))));
        puVar11[1] = CONCAT17(uStack_2b1,
                              CONCAT16(uStack_2b1,
                                       CONCAT15(uStack_2b2,
                                                CONCAT14(uStack_2b2,
                                                         CONCAT13(uStack_2b3,
                                                                  CONCAT12(uStack_2b3,
                                                                           CONCAT11(uStack_2b4,
                                                                                    uStack_2b4))))))
                             );
        puVar11 = (undefined8 *)(in_RDI + (long)(local_368 + 2) * 8);
        *puVar11 = CONCAT17(uStack_28d,
                            CONCAT16(uStack_28d,
                                     CONCAT15(uStack_28e,
                                              CONCAT14(uStack_28e,
                                                       CONCAT13(uStack_28f,
                                                                CONCAT12(uStack_28f,
                                                                         CONCAT11(uStack_290,
                                                                                  uStack_290)))))));
        puVar11[1] = CONCAT17(uStack_289,
                              CONCAT16(uStack_289,
                                       CONCAT15(uStack_28a,
                                                CONCAT14(uStack_28a,
                                                         CONCAT13(uStack_28b,
                                                                  CONCAT12(uStack_28b,
                                                                           CONCAT11(uStack_28c,
                                                                                    uStack_28c))))))
                             );
      }
      else {
        auVar7[1] = local_2b8;
        auVar7[0] = local_2b8;
        auVar7[2] = uStack_2b7;
        auVar7[3] = uStack_2b7;
        auVar7[4] = uStack_2b6;
        auVar7[5] = uStack_2b6;
        auVar7[6] = uStack_2b5;
        auVar7[7] = uStack_2b5;
        auVar7[9] = uStack_2b4;
        auVar7[8] = uStack_2b4;
        auVar7[10] = uStack_2b3;
        auVar7[0xb] = uStack_2b3;
        auVar7[0xc] = uStack_2b2;
        auVar7[0xd] = uStack_2b2;
        auVar7[0xe] = uStack_2b1;
        auVar7[0xf] = uStack_2b1;
        auVar6._8_8_ = 0xf0e0f0e0f0e0f0e;
        auVar6._0_8_ = 0x706070607060706;
        auVar13 = pshufb(auVar7,auVar6);
        auVar5[1] = uStack_290;
        auVar5[0] = uStack_290;
        auVar5[2] = uStack_28f;
        auVar5[3] = uStack_28f;
        auVar5[4] = uStack_28e;
        auVar5[5] = uStack_28e;
        auVar5[6] = uStack_28d;
        auVar5[7] = uStack_28d;
        auVar5[9] = uStack_28c;
        auVar5[8] = uStack_28c;
        auVar5[10] = uStack_28b;
        auVar5[0xb] = uStack_28b;
        auVar5[0xc] = uStack_28a;
        auVar5[0xd] = uStack_28a;
        auVar5[0xe] = uStack_289;
        auVar5[0xf] = uStack_289;
        auVar4._8_8_ = 0xf0e0f0e0f0e0f0e;
        auVar4._0_8_ = 0x706070607060706;
        auVar14 = pshufb(auVar5,auVar4);
        auVar9[1] = local_2b8;
        auVar9[0] = local_2b8;
        auVar9[2] = uStack_2b7;
        auVar9[3] = uStack_2b7;
        auVar9[4] = uStack_2b6;
        auVar9[5] = uStack_2b6;
        auVar9[6] = uStack_2b5;
        auVar9[7] = uStack_2b5;
        auVar9[9] = uStack_2b4;
        auVar9[8] = uStack_2b4;
        auVar9[10] = uStack_2b3;
        auVar9[0xb] = uStack_2b3;
        auVar9[0xc] = uStack_2b2;
        auVar9[0xd] = uStack_2b2;
        auVar9[0xe] = uStack_2b1;
        auVar9[0xf] = uStack_2b1;
        auVar15 = pmulhuw(auVar9,auVar13);
        auVar8[1] = uStack_290;
        auVar8[0] = uStack_290;
        auVar8[2] = uStack_28f;
        auVar8[3] = uStack_28f;
        auVar8[4] = uStack_28e;
        auVar8[5] = uStack_28e;
        auVar8[6] = uStack_28d;
        auVar8[7] = uStack_28d;
        auVar8[9] = uStack_28c;
        auVar8[8] = uStack_28c;
        auVar8[10] = uStack_28b;
        auVar8[0xb] = uStack_28b;
        auVar8[0xc] = uStack_28a;
        auVar8[0xd] = uStack_28a;
        auVar8[0xe] = uStack_289;
        auVar8[0xf] = uStack_289;
        auVar13 = pmulhuw(auVar8,auVar14);
        local_1b8 = auVar15._0_2_;
        sStack_1b6 = auVar15._2_2_;
        sStack_1b4 = auVar15._4_2_;
        sStack_1b2 = auVar15._6_2_;
        sStack_1b0 = auVar15._8_2_;
        sStack_1ae = auVar15._10_2_;
        sStack_1ac = auVar15._12_2_;
        sStack_1aa = auVar15._14_2_;
        local_418._2_2_ = sStack_1b6 - (sStack_1b6 >> 0xf);
        local_418._0_2_ = local_1b8 - (local_1b8 >> 0xf);
        local_418._4_2_ = sStack_1b4 - (sStack_1b4 >> 0xf);
        local_418._6_2_ = sStack_1b2 - (sStack_1b2 >> 0xf);
        stack0xfffffffffffffbf0 = sStack_1b0 - (sStack_1b0 >> 0xf);
        stack0xfffffffffffffbf2 = sStack_1ae - (sStack_1ae >> 0xf);
        stack0xfffffffffffffbf4 = sStack_1ac - (sStack_1ac >> 0xf);
        stack0xfffffffffffffbf6 = sStack_1aa - (sStack_1aa >> 0xf);
        local_1d8 = auVar13._0_2_;
        sStack_1d6 = auVar13._2_2_;
        sStack_1d4 = auVar13._4_2_;
        sStack_1d2 = auVar13._6_2_;
        sStack_1d0 = auVar13._8_2_;
        sStack_1ce = auVar13._10_2_;
        sStack_1cc = auVar13._12_2_;
        sStack_1ca = auVar13._14_2_;
        local_428._2_2_ = sStack_1d6 - (sStack_1d6 >> 0xf);
        local_428._0_2_ = local_1d8 - (local_1d8 >> 0xf);
        local_428._4_2_ = sStack_1d4 - (sStack_1d4 >> 0xf);
        local_428._6_2_ = sStack_1d2 - (sStack_1d2 >> 0xf);
        local_428._8_2_ = sStack_1d0 - (sStack_1d0 >> 0xf);
        local_428._10_2_ = sStack_1ce - (sStack_1ce >> 0xf);
        local_428._12_2_ = sStack_1cc - (sStack_1cc >> 0xf);
        local_428._14_2_ = sStack_1ca - (sStack_1ca >> 0xf);
        auVar3[1] = local_2b8;
        auVar3[0] = local_2b8;
        auVar3[2] = uStack_2b7;
        auVar3[3] = uStack_2b7;
        auVar3[4] = uStack_2b6;
        auVar3[5] = uStack_2b6;
        auVar3[6] = uStack_2b5;
        auVar3[7] = uStack_2b5;
        auVar3[8] = uStack_2b4;
        auVar3[9] = uStack_2b4;
        auVar3[10] = uStack_2b3;
        auVar3[0xb] = uStack_2b3;
        auVar3[0xc] = uStack_2b2;
        auVar3[0xd] = uStack_2b2;
        auVar3[0xe] = uStack_2b1;
        auVar3[0xf] = uStack_2b1;
        _local_418 = pblendw(_local_418,auVar3,0x88);
        auVar2[1] = uStack_290;
        auVar2[0] = uStack_290;
        auVar2[2] = uStack_28f;
        auVar2[3] = uStack_28f;
        auVar2[4] = uStack_28e;
        auVar2[5] = uStack_28e;
        auVar2[6] = uStack_28d;
        auVar2[7] = uStack_28d;
        auVar2[8] = uStack_28c;
        auVar2[9] = uStack_28c;
        auVar2[10] = uStack_28b;
        auVar2[0xb] = uStack_28b;
        auVar2[0xc] = uStack_28a;
        auVar2[0xd] = uStack_28a;
        auVar2[0xe] = uStack_289;
        auVar2[0xf] = uStack_289;
        auVar13 = pblendw(local_428,auVar2,0x88);
        puVar11 = (undefined8 *)(in_RDI + (long)local_368 * 8);
        *puVar11 = local_418;
        puVar11[1] = this;
        puVar11 = (undefined8 *)(in_RDI + (long)(local_368 + 2) * 8);
        local_428._0_8_ = auVar13._0_8_;
        local_428._8_8_ = auVar13._8_8_;
        *puVar11 = local_428._0_8_;
        puVar11[1] = local_428._8_8_;
      }
    }
  }
  for (local_42c = 0; local_42c < 3 && local_368 < in_EDX; local_42c = local_42c + 1) {
    QRgba64::fromArgb32(rgb);
    QVar12 = QRgba64::premultiplied(this);
    *(quint64 *)(in_RDI + (long)local_368 * 8) = QVar12.rgba;
    local_368 = local_368 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void convertARGBToRGBA64PM_sse4(QRgba64 *buffer, const uint *src, int count)
{
    int i = 0;
    const __m128i alphaMask = _mm_set1_epi32(0xff000000);
    const __m128i rgbaMask = _mm_setr_epi8(2, 1, 0, 3, 6, 5, 4, 7, 10, 9, 8, 11, 14, 13, 12, 15);
    const __m128i shuffleMask = _mm_setr_epi8(6, 7, 6, 7, 6, 7, 6, 7, 14, 15, 14, 15, 14, 15, 14, 15);
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[i]);
        if (!_mm_testz_si128(srcVector, alphaMask)) {
            bool cf = _mm_testc_si128(srcVector, alphaMask);

            if (!RGBA)
                srcVector = _mm_shuffle_epi8(srcVector, rgbaMask);
            const __m128i src1 = _mm_unpacklo_epi8(srcVector, srcVector);
            const __m128i src2 = _mm_unpackhi_epi8(srcVector, srcVector);
            if (!cf) {
                __m128i alpha1 = _mm_shuffle_epi8(src1, shuffleMask);
                __m128i alpha2 = _mm_shuffle_epi8(src2, shuffleMask);
                __m128i dst1 = _mm_mulhi_epu16(src1, alpha1);
                __m128i dst2 = _mm_mulhi_epu16(src2, alpha2);
                // Map 0->0xfffe to 0->0xffff
                dst1 = _mm_add_epi16(dst1, _mm_srli_epi16(dst1, 15));
                dst2 = _mm_add_epi16(dst2, _mm_srli_epi16(dst2, 15));
                // correct alpha value:
                dst1 = _mm_blend_epi16(dst1, src1, 0x88);
                dst2 = _mm_blend_epi16(dst2, src2, 0x88);
                _mm_storeu_si128((__m128i *)&buffer[i], dst1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], dst2);
            } else {
                _mm_storeu_si128((__m128i *)&buffer[i], src1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], src2);
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i], zero);
            _mm_storeu_si128((__m128i *)&buffer[i + 2], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        const uint s = RGBA ? RGBA2ARGB(src[i]) : src[i];
        buffer[i] = QRgba64::fromArgb32(s).premultiplied();
    }
}